

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::ExplicitProducer
          (ExplicitProducer *this,ConcurrentQueue<_zframe_t_*,_MyTraits> *parent)

{
  unsigned_long uVar1;
  long in_RSI;
  __pointer_type in_RDI;
  size_t in_stack_00000010;
  ExplicitProducer *in_stack_00000018;
  size_t poolBasedIndexSize;
  atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>
  *in_stack_ffffffffffffffd0;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_ffffffffffffffd8;
  ProducerBase *in_stack_ffffffffffffffe0;
  
  ProducerBase::ProducerBase
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
  in_RDI->size = (size_t)&PTR__ExplicitProducer_005d6100;
  std::
  atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::BlockIndexHeader_*>::
  atomic(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI[3].size = 0;
  in_RDI[3].front.super___atomic_base<unsigned_long>._M_i = 0x10;
  in_RDI[3].entries = (BlockIndexEntry *)0x0;
  in_RDI[3].prev = (void *)0x0;
  in_RDI[4].size = 0;
  uVar1 = details::ceil_to_pow_2<unsigned_long>(*(unsigned_long *)(in_RSI + 0x20));
  if (in_RDI[3].front.super___atomic_base<unsigned_long>._M_i < uVar1 >> 1) {
    in_RDI[3].front.super___atomic_base<unsigned_long>._M_i = uVar1 >> 1;
  }
  new_block_index(in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

explicit ExplicitProducer(ConcurrentQueue* parent) :
			ProducerBase(parent, true),
			blockIndex(nullptr),
			pr_blockIndexSlotsUsed(0),
			pr_blockIndexSize(EXPLICIT_INITIAL_INDEX_SIZE >> 1),
			pr_blockIndexFront(0),
			pr_blockIndexEntries(nullptr),
			pr_blockIndexRaw(nullptr)
		{
			size_t poolBasedIndexSize = details::ceil_to_pow_2(parent->initialBlockPoolSize) >> 1;
			if (poolBasedIndexSize > pr_blockIndexSize) {
				pr_blockIndexSize = poolBasedIndexSize;
			}
			
			new_block_index(0);		// This creates an index with double the number of current entries, i.e. EXPLICIT_INITIAL_INDEX_SIZE
		}